

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# civetweb.c
# Opt level: O0

int mg_strcasecmp(char *s1,char *s2)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  char *pcStack_18;
  int diff;
  char *s2_local;
  char *s1_local;
  
  pcStack_18 = s2;
  s2_local = s1;
  do {
    iVar1 = lowercase(s2_local);
    iVar2 = lowercase(pcStack_18);
    bVar3 = false;
    if (iVar1 - iVar2 == 0) {
      bVar3 = *s2_local != '\0';
    }
    pcStack_18 = pcStack_18 + 1;
    s2_local = s2_local + 1;
  } while (bVar3);
  return iVar1 - iVar2;
}

Assistant:

CIVETWEB_API int
mg_strcasecmp(const char *s1, const char *s2)
{
	int diff;

	do {
		diff = lowercase(s1++) - lowercase(s2++);
	} while (diff == 0 && s1[-1] != '\0');

	return diff;
}